

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS VerifyJsonParsesAsDictionaryOfNumbers(_Bool IsJson5,char *Json,size_t NumItems)

{
  WJTL_STATUS WVar1;
  JL_DATA_TYPE JVar2;
  JL_STATUS JVar3;
  JL_STATUS JVar4;
  WJTL_STATUS WVar5;
  ulong uVar6;
  bool bVar7;
  uint64_t u64;
  JlDataObject *object;
  JlDataObject *dictionaryObject;
  char itemName [16];
  size_t errorAtPos;
  uint64_t local_60;
  JlDataObject *local_58;
  JlDataObject *local_50;
  char local_48 [16];
  size_t local_38;
  
  local_50 = (JlDataObject *)0x0;
  local_38 = 100;
  WVar1 = JlParseJsonEx(Json,IsJson5,&local_50,&local_38);
  bVar7 = WVar1 == WJTL_STATUS_SUCCESS;
  if (!bVar7) {
    WVar1 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(bVar7,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsDictionaryOfNumbers",0x379);
  if (local_50 != (JlDataObject *)0x0) {
    JVar2 = JlGetObjectType(local_50);
    WVar5 = WJTL_STATUS_FAILED;
    if (JVar2 == JL_DATA_TYPE_DICTIONARY) {
      WVar5 = WVar1;
    }
    WjTestLib_Assert(JVar2 == JL_DATA_TYPE_DICTIONARY,
                     "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfNumbers",0x37c);
    if (NumItems != 0) {
      uVar6 = 1;
      do {
        local_58 = (JlDataObject *)0x0;
        local_60 = 0;
        local_48[0] = '\0';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        sprintf(local_48,"item%u",uVar6 & 0xffffffff);
        JVar3 = JlGetObjectFromDictionaryByKey(local_50,local_48,&local_58);
        WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsDictionaryOfNumbers",0x385);
        JVar4 = JlGetObjectNumberU64(local_58,&local_60);
        WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsDictionaryOfNumbers",0x386);
        if (uVar6 != local_60) {
          WVar5 = WJTL_STATUS_FAILED;
        }
        WjTestLib_Assert(uVar6 == local_60,"u64 == num",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsDictionaryOfNumbers",0x387);
        if (JVar4 != JL_STATUS_SUCCESS || JVar3 != JL_STATUS_SUCCESS) {
          WVar5 = WJTL_STATUS_FAILED;
        }
        bVar7 = uVar6 != NumItems;
        uVar6 = uVar6 + 1;
      } while (bVar7);
    }
    JVar3 = JlFreeObjectTree(&local_50);
    WVar1 = WJTL_STATUS_FAILED;
    if (JVar3 == JL_STATUS_SUCCESS) {
      WVar1 = WVar5;
    }
    WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &dictionaryObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfNumbers",0x38b);
  }
  return WVar1;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsDictionaryOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        size_t          NumItems
    )
{
    JlDataObject*   dictionaryObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ) );
    if( NULL == dictionaryObject ) { return TestReturn; }

    JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );

    for( size_t num=1; num<=NumItems; num++ )
    {
        JlDataObject* object = NULL;
        uint64_t u64 = 0;
        char itemName [16] = {0};
        sprintf( itemName, "item%u", (uint32_t)num );

        JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ) );
        JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
        JL_ASSERT( u64 == num );
    }

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &dictionaryObject ) );

    return TestReturn;
}